

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glloader.c
# Opt level: O1

ktx_error_code_e
compressedTexImage2DCallback
          (int miplevel,int face,int width,int height,int depth,ktx_uint64_t faceLodSize,
          void *pixels,void *userdata)

{
  GLenum srcFormat;
  GLenum GVar1;
  ktx_error_code_e kVar2;
  int iVar3;
  GLenum internalformat;
  GLenum type;
  GLenum format;
  GLubyte *unpacked;
  
  kVar2 = KTX_INVALID_OPERATION;
  if (faceLodSize >> 0x20 == 0) {
    iVar3 = *(int *)((long)userdata + 0x14);
    if (*(int *)((long)userdata + 0x14) == 0) {
      iVar3 = height;
    }
    (*gl.glCompressedTexImage2D)
              (*userdata + face,miplevel,*(GLenum *)((long)userdata + 8),width,iVar3,0,
               (GLsizei)faceLodSize,pixels);
    GVar1 = (*gl.glGetError)();
    if (((GVar1 & 0xfffffffe) == 0x500) &&
       (srcFormat = *(GLenum *)((long)userdata + 8), srcFormat == 0x8d64 || srcFormat - 0x9270 < 10)
       ) {
      kVar2 = _ktxUnpackETC((GLubyte *)pixels,srcFormat,width,height,&unpacked,&format,
                            &internalformat,&type,R16Formats,supportsSRGB ^ 1);
      if (kVar2 == KTX_SUCCESS) {
        if (((byte)sizedFormats & 1) == 0) {
          if (internalformat == 0x8058) {
            internalformat = 0x1908;
          }
          else if (internalformat == 0x8051) {
            internalformat = 0x1907;
          }
        }
        if (*(int *)((long)userdata + 0x14) != 0) {
          height = *(int *)((long)userdata + 0x14);
        }
        (*gl.glTexImage2D)(face + *userdata,miplevel,internalformat,width,height,0,format,type,
                           unpacked);
        free(unpacked);
        GVar1 = (*gl.glGetError)();
      }
      if (kVar2 != KTX_SUCCESS) {
        return kVar2;
      }
    }
    *(GLenum *)((long)userdata + 0x10) = GVar1;
    kVar2 = (uint)(GVar1 != 0) * 9;
  }
  return kVar2;
}

Assistant:

KTX_error_code
compressedTexImage2DCallback(int miplevel, int face,
                             int width, int height,
                             int depth,
                             ktx_uint64_t faceLodSize,
                             void* pixels, void* userdata)
{
    ktx_cbdata* cbData = (ktx_cbdata*)userdata;
    GLenum glerror;
    KTX_error_code result;
    UNUSED(depth);

    if (faceLodSize > UINT32_MAX)
        return KTX_INVALID_OPERATION; // Too big for OpenGL {,ES}.

    // It is simpler to just attempt to load the format, rather than divine
    // which formats are supported by the implementation. In the event of an
    // error, software unpacking can be attempted.
    glCompressedTexImage2D(cbData->glTarget + face, miplevel,
                           cbData->glInternalformat, width,
                           cbData->numLayers == 0 ? (GLuint)height : cbData->numLayers,
                           0,
                           (ktx_uint32_t)faceLodSize, pixels);

    glerror = glGetError();
#if SUPPORT_SOFTWARE_ETC_UNPACK
    // Renderion is returning INVALID_VALUE. Oops!!
    if ((glerror == GL_INVALID_ENUM || glerror == GL_INVALID_VALUE)
        && (cbData->glInternalformat == GL_ETC1_RGB8_OES
            || (cbData->glInternalformat >= GL_COMPRESSED_R11_EAC
                && cbData->glInternalformat <= GL_COMPRESSED_SRGB8_ALPHA8_ETC2_EAC)
            ))
    {
        GLubyte* unpacked;
        GLenum format, internalformat, type;

        result = _ktxUnpackETC((GLubyte*)pixels, cbData->glInternalformat,
                                  width, height, &unpacked,
                                  &format, &internalformat,
                                  &type, R16Formats, supportsSRGB);
        if (result != KTX_SUCCESS) {
            return result;
        }
        if (!(sizedFormats & _NON_LEGACY_FORMATS)) {
            if (internalformat == GL_RGB8)
                internalformat = GL_RGB;
            else if (internalformat == GL_RGBA8)
                internalformat = GL_RGBA;
        }
        glTexImage2D(cbData->glTarget + face, miplevel,
                     internalformat, width,
                     cbData->numLayers == 0 ? (GLuint)height : cbData->numLayers, 0,
                     format, type, unpacked);

        free(unpacked);
        glerror = glGetError();
    }
#endif

    if ((cbData->glError = glerror) == GL_NO_ERROR) {
        return KTX_SUCCESS;
    } else {
        return KTX_GL_ERROR;
    }
}